

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O0

wchar_t pax_attribute_read_time
                  (archive_read *a,size_t value_length,int64_t *ps,long *pn,int64_t *unconsumed)

{
  undefined1 auStack_50 [4];
  wchar_t r;
  archive_string as;
  int64_t *unconsumed_local;
  long *pn_local;
  int64_t *ps_local;
  size_t value_length_local;
  archive_read *a_local;
  
  as.buffer_length = (size_t)unconsumed;
  if (value_length < 0x81) {
    _auStack_50 = (char *)0x0;
    as.s = (char *)0x0;
    as.length = 0;
    a_local._4_4_ = read_bytes_to_string(a,(archive_string *)auStack_50,value_length,unconsumed);
    if (a_local._4_4_ < L'\0') {
      archive_string_free((archive_string *)auStack_50);
    }
    else {
      pax_time(_auStack_50,(size_t)as.s,ps,pn);
      archive_string_free((archive_string *)auStack_50);
      if ((*ps < 0) || (*ps == 0x7fffffffffffffff)) {
        a_local._4_4_ = L'\xffffffec';
      }
      else {
        a_local._4_4_ = L'\0';
      }
    }
  }
  else {
    __archive_read_consume(a,value_length);
    *ps = 0;
    *pn = 0;
    a_local._4_4_ = L'\xffffffe2';
  }
  return a_local._4_4_;
}

Assistant:

static int
pax_attribute_read_time(struct archive_read *a, size_t value_length, int64_t *ps, long *pn, int64_t *unconsumed) {
	struct archive_string as;
	int r;

	if (value_length > 128) {
		__archive_read_consume(a, value_length);
		*ps = 0;
		*pn = 0;
		return (ARCHIVE_FATAL);
	}

	archive_string_init(&as);
	r = read_bytes_to_string(a, &as, value_length, unconsumed);
	if (r < ARCHIVE_OK) {
		archive_string_free(&as);
		return (r);
	}

	pax_time(as.s, archive_strlen(&as), ps, pn);
	archive_string_free(&as);
	if (*ps < 0 || *ps == INT64_MAX) {
		return (ARCHIVE_WARN);
	}
	return (ARCHIVE_OK);
}